

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaj3.c
# Opt level: O1

void Zyx_ManPrintSolution(Zyx_Man_t *p,int fCompl,int fFirst)

{
  uint uVar1;
  word *pwVar2;
  ulong *puVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  Bmc_EsPar_t *pBVar9;
  FILE *__stream;
  char cVar10;
  ulong *puVar11;
  uint uVar12;
  ulong uVar13;
  char *pcVar14;
  long lVar15;
  int iVar16;
  char local_418 [1000];
  
  pBVar9 = p->pPars;
  pcVar14 = "MAJ-gates";
  if (pBVar9->fMajority == 0) {
    pcVar14 = "LUTs";
  }
  printf("Realization of given %d-input function using %d %d-input %s:\n",(ulong)(uint)pBVar9->nVars
         ,(ulong)(uint)pBVar9->nNodes,(ulong)(uint)pBVar9->nLutSize,pcVar14);
  uVar12 = p->nObjs;
  pBVar9 = p->pPars;
  uVar5 = uVar12;
  if (pBVar9->nVars < (int)uVar12) {
    do {
      uVar5 = uVar5 - 1;
      uVar1 = uVar12 - 1;
      printf("%02d = ");
      if (p->pPars->fMajority == 0) {
        printf("%d\'b",(ulong)(uint)(1 << ((byte)p->pPars->nLutSize & 0x1f)));
        iVar7 = p->LutMask;
        if (-1 < p->LutMask) {
          do {
            uVar6 = bmcg_sat_solver_read_cex_varvalue
                              (p->pSat,(uVar5 - p->pPars->nVars) * (p->LutMask + 1) + iVar7);
            printf("%d",(ulong)((uVar12 == p->nObjs && fCompl != 0) ^ uVar6));
            bVar4 = 0 < iVar7;
            iVar7 = iVar7 + -1;
          } while (bVar4);
        }
      }
      else {
        printf("MAJ3");
      }
      putchar(0x28);
      if (1 < (int)uVar12) {
        uVar12 = 0;
        do {
          iVar7 = bmcg_sat_solver_read_cex_varvalue
                            (p->pSat,(uVar5 - p->pPars->nVars) * p->nObjs + p->TopoBase + uVar12);
          if (iVar7 != 0) {
            if ((int)uVar12 < p->pPars->nVars) {
              pcVar14 = " %c";
              uVar6 = uVar12 + 0x61;
            }
            else {
              pcVar14 = " %02d";
              uVar6 = uVar12;
            }
            printf(pcVar14,(ulong)uVar6);
          }
          uVar12 = uVar12 + 1;
        } while (uVar5 != uVar12);
      }
      puts(" )");
      pBVar9 = p->pPars;
      uVar12 = uVar1;
    } while (pBVar9->nVars < (int)uVar1);
  }
  if (pBVar9->fMajority == 0) {
    if (fCompl != 0) {
      uVar12 = 1 << ((char)pBVar9->nVars - 6U & 0x1f);
      if (pBVar9->nVars < 7) {
        uVar12 = 1;
      }
      if (0 < (int)uVar12) {
        pwVar2 = p->pTruth;
        uVar13 = 0;
        do {
          pwVar2[uVar13] = ~pwVar2[uVar13];
          uVar13 = uVar13 + 1;
        } while (uVar12 != uVar13);
      }
    }
    iVar7 = pBVar9->nVars;
    if (iVar7 < 2) {
      __assert_fail("nVars >= 2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/utilTruth.h"
                    ,0x4f1,"int Abc_TtWriteHexRev(char *, word *, int)");
    }
    iVar16 = 1 << ((char)iVar7 - 6U & 0x1f);
    if (iVar7 < 7) {
      iVar16 = 1;
    }
    puVar3 = p->pTruth;
    puVar11 = puVar3 + (long)iVar16 + -1;
    if (puVar3 <= puVar11) {
      uVar13 = 0xf;
      if (iVar7 < 6) {
        uVar13 = (ulong)(uint)~(-1 << ((char)iVar7 - 2U & 0x1f));
      }
      pcVar14 = local_418;
      lVar15 = uVar13 << 2;
      do {
        uVar12 = (uint)(*puVar11 >> ((byte)lVar15 & 0x3c)) & 0xf;
        cVar10 = '7';
        if (uVar12 < 10) {
          cVar10 = '0';
        }
        *pcVar14 = cVar10 + (char)uVar12;
        pcVar14 = pcVar14 + 1;
        lVar15 = lVar15 + -4;
      } while ((lVar15 != -4) || (puVar11 = puVar11 + -1, lVar15 = uVar13 << 2, puVar3 <= puVar11));
    }
    if (fCompl != 0) {
      iVar7 = p->pPars->nVars;
      uVar12 = 1 << ((char)iVar7 - 6U & 0x1f);
      if (iVar7 < 7) {
        uVar12 = 1;
      }
      if (0 < (int)uVar12) {
        pwVar2 = p->pTruth;
        uVar13 = 0;
        do {
          pwVar2[uVar13] = ~pwVar2[uVar13];
          uVar13 = uVar13 + 1;
        } while (uVar12 != uVar13);
      }
    }
    pBVar9 = p->pPars;
    sprintf(local_418 + (1 << ((char)pBVar9->nVars - 2U & 0x1f)),"-%d-%d.bool",
            (ulong)(uint)pBVar9->nLutSize,(ulong)(uint)pBVar9->nNodes);
    pcVar14 = "wb";
    if (fFirst == 0) {
      pcVar14 = "ab";
    }
    __stream = fopen(local_418,pcVar14);
    if (__stream == (FILE *)0x0) {
      pcVar14 = "Cannot open input file \"%s\".\n";
    }
    else {
      iVar7 = p->pPars->nVars;
      if (iVar7 < p->nObjs) {
        do {
          fputc(iVar7 + 0x41,__stream);
          if (p->pPars->fMajority == 0) {
            iVar16 = p->LutMask;
            if (-1 < p->LutMask) {
              do {
                uVar12 = bmcg_sat_solver_read_cex_varvalue
                                   (p->pSat,(iVar7 - p->pPars->nVars) * (p->LutMask + 1) + iVar16);
                fprintf(__stream,"%d",(ulong)((iVar7 == p->nObjs + -1 && fCompl != 0) ^ uVar12));
                bVar4 = 0 < iVar16;
                iVar16 = iVar16 + -1;
              } while (bVar4);
            }
            if (0 < iVar7) {
              iVar16 = 0;
              do {
                iVar8 = bmcg_sat_solver_read_cex_varvalue
                                  (p->pSat,(iVar7 - p->pPars->nVars) * p->nObjs + p->TopoBase +
                                           iVar16);
                if (iVar8 != 0) {
                  fputc((uint)(iVar16 < p->pPars->nVars) * 0x20 + iVar16 + 0x41,__stream);
                }
                iVar16 = iVar16 + 1;
              } while (iVar7 != iVar16);
            }
          }
          else {
            fwrite("maj3",4,1,__stream);
          }
          fputc(10,__stream);
          iVar7 = iVar7 + 1;
        } while (iVar7 < p->nObjs);
      }
      fputc(10,__stream);
      fclose(__stream);
      pcVar14 = "Dumped solution into file \"%s\".\n";
    }
    printf(pcVar14,local_418);
  }
  return;
}

Assistant:

static void Zyx_ManPrintSolution( Zyx_Man_t * p, int fCompl, int fFirst )
{
    int i, k;
    printf( "Realization of given %d-input function using %d %d-input %s:\n", 
        p->pPars->nVars, p->pPars->nNodes, p->pPars->nLutSize, p->pPars->fMajority ? "MAJ-gates" : "LUTs" );
    for ( i = p->nObjs - 1; i >= p->pPars->nVars; i-- )
    {
        printf( "%02d = ", i );
        if ( p->pPars->fMajority )
            printf( "MAJ3" );
        else
        {
            printf( "%d\'b", 1 << p->pPars->nLutSize );
            for ( k = p->LutMask; k >= 0; k-- )
                printf( "%d", bmcg_sat_solver_read_cex_varvalue(p->pSat, Zyx_FuncVar(p, i, k)) ^ (i == p->nObjs - 1 && fCompl) );
        }
        printf( "(" );
        for ( k = 0; k < i; k++ )
            if ( bmcg_sat_solver_read_cex_varvalue(p->pSat, Zyx_TopoVar(p, i, k)) )
            {
                if ( k >= 0 && k < p->pPars->nVars )
                    printf( " %c", 'a'+k );
                else
                    printf( " %02d", k );
            }
        printf( " )\n" );
    }
    if ( !p->pPars->fMajority )
        Zyx_ManPrintSolutionFile( p, fCompl, fFirst );
}